

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_retain_grow_limit_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  size_t *new_limit_00;
  size_t __n;
  int iVar4;
  size_t old_limit;
  size_t new_limit;
  
  if (!opt_retain) {
    return 2;
  }
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  uVar1 = mib[1];
  iVar4 = 0xe;
  if (((uVar1 >> 0x20 == 0) && (uVar3 = narenas_total_get(), (uint)uVar1 < uVar3)) &&
     ((arena_t *)arenas[uVar1].repr != (arena_t *)0x0)) {
    iVar4 = 0x16;
    if (newp == (void *)0x0) {
      new_limit_00 = (size_t *)0x0;
    }
    else {
      if (newlen != 8) goto LAB_00119509;
      new_limit = *newp;
      new_limit_00 = &new_limit;
    }
    _Var2 = arena_retain_grow_limit_get_set
                      (tsd,(arena_t *)arenas[uVar1].repr,&old_limit,new_limit_00);
    if (_Var2) {
      iVar4 = 0xe;
    }
    else {
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 != 8) {
          __n = 8;
          if (uVar1 < 8) {
            __n = uVar1;
          }
          memcpy(oldp,&old_limit,__n);
          goto LAB_00119509;
        }
        *(size_t *)oldp = old_limit;
      }
      iVar4 = 0;
    }
  }
LAB_00119509:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar4;
}

Assistant:

static int
arena_i_retain_grow_limit_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	if (!opt_retain) {
		/* Only relevant when retain is enabled. */
		return ENOENT;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get() && (arena =
	    arena_get(tsd_tsdn(tsd), arena_ind, false)) != NULL) {
		size_t old_limit, new_limit;
		if (newp != NULL) {
			WRITE(new_limit, size_t);
		}
		bool err = arena_retain_grow_limit_get_set(tsd, arena,
		    &old_limit, newp != NULL ? &new_limit : NULL);
		if (!err) {
			READ(old_limit, size_t);
			ret = 0;
		} else {
			ret = EFAULT;
		}
	} else {
		ret = EFAULT;
	}
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}